

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetClipboardTextFn_DefaultImpl(void *param_1,char *text)

{
  int iVar1;
  ImGuiContext *pIVar2;
  size_t sVar3;
  char *pcVar4;
  char *text_end;
  ImGuiContext *g;
  char *text_local;
  void *param_0_local;
  
  pIVar2 = GImGui;
  ImVector<char>::clear(&GImGui->PrivateClipboard);
  sVar3 = strlen(text);
  iVar1 = (int)(text + sVar3);
  ImVector<char>::resize(&pIVar2->PrivateClipboard,(iVar1 - (int)text) + 1);
  pcVar4 = ImVector<char>::operator[](&pIVar2->PrivateClipboard,0);
  memcpy(pcVar4,text,(long)(text + sVar3) - (long)text);
  pcVar4 = ImVector<char>::operator[](&pIVar2->PrivateClipboard,iVar1 - (int)text);
  *pcVar4 = '\0';
  return;
}

Assistant:

static void SetClipboardTextFn_DefaultImpl(void*, const char* text)
{
    ImGuiContext& g = *GImGui;
    g.PrivateClipboard.clear();
    const char* text_end = text + strlen(text);
    g.PrivateClipboard.resize((int)(text_end - text) + 1);
    memcpy(&g.PrivateClipboard[0], text, (size_t)(text_end - text));
    g.PrivateClipboard[(int)(text_end - text)] = 0;
}